

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int getDefendingCountry(Country *fromCountry,Player *player)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  size_type sVar7;
  void *this;
  PlayerStrategy *pPVar8;
  ulong uVar9;
  __type local_fd;
  string local_90;
  reference local_70;
  Country **neighbour;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  string local_40;
  int local_1c;
  Player *pPStack_18;
  int toCountryIndex;
  Player *player_local;
  Country *fromCountry_local;
  
  local_1c = 0;
  pPStack_18 = player;
  player_local = (Player *)fromCountry;
  do {
    std::ios::clear((long)&std::cin + *(long *)(std::cin + -0x18),0);
    poVar5 = std::operator<<((ostream *)&std::cout,"\nCountry ");
    Map::Country::getCountryName_abi_cxx11_(&local_40,(Country *)player_local);
    poVar5 = std::operator<<(poVar5,(string *)&local_40);
    poVar5 = std::operator<<(poVar5," has ");
    pvVar6 = Map::Country::getAdjCountries((Country *)player_local);
    sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
    std::operator<<(poVar5," neighbour(s):\n");
    std::__cxx11::string::~string((string *)&local_40);
    pvVar6 = Map::Country::getAdjCountries((Country *)player_local);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
    neighbour = (Country **)
                std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                       *)&neighbour), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                 ::operator*(&__end2);
      poVar5 = std::operator<<((ostream *)&std::cout,"\t\tName: ");
      Map::Country::getCountryName_abi_cxx11_(&local_90,*local_70);
      poVar5 = std::operator<<(poVar5,(string *)&local_90);
      poVar5 = std::operator<<(poVar5," Armies: ");
      iVar4 = Map::Country::getNumberOfTroops(*local_70);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
      poVar5 = std::operator<<(poVar5," Owned by: Player ");
      iVar4 = Map::Country::getPlayerOwnerID(*local_70);
      this = (void *)std::ostream::operator<<(poVar5,iVar4);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_90);
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "\n[ATTACKER] Which country would you like to attack?(0 to ");
    pvVar6 = Map::Country::getAdjCountries((Country *)player_local);
    sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7 - 1);
    std::operator<<(poVar5,")");
    pPVar8 = Player::getStrategy(pPStack_18);
    iVar4 = (*pPVar8->_vptr_PlayerStrategy[1])();
    local_1c = iVar4;
    if (iVar4 < 0) {
LAB_0011601d:
      std::operator<<((ostream *)&std::cout,"\nInvalid Input. Please try again.\n");
    }
    else {
      pvVar6 = Map::Country::getAdjCountries((Country *)player_local);
      sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
      if ((((int)sVar7 < iVar4) || (uVar9 = std::ios::fail(), (uVar9 & 1) != 0)) ||
         (_Var2 = std::isnan<int>(local_1c), _Var2)) goto LAB_0011601d;
    }
    iVar4 = local_1c;
    local_fd = true;
    if (-1 < local_1c) {
      pvVar6 = Map::Country::getAdjCountries((Country *)player_local);
      sVar7 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(pvVar6);
      local_fd = true;
      if (iVar4 <= (int)sVar7) {
        bVar3 = std::ios::fail();
        local_fd = true;
        if ((bVar3 & 1) == 0) {
          local_fd = std::isnan<int>(local_1c);
        }
      }
    }
    if (local_fd == false) {
      return local_1c;
    }
  } while( true );
}

Assistant:

static int getDefendingCountry(Map::Country *fromCountry, Player *player) {

    int toCountryIndex = 0;
    do {
        std::cin.clear();
        std::cout << "\nCountry " << fromCountry->getCountryName() << " has "
                  << fromCountry->getAdjCountries()->size()
                  << " neighbour(s):\n";
        for (auto &neighbour: *fromCountry->getAdjCountries()) {
            std::cout << "\t\tName: " << neighbour->getCountryName() << " Armies: " << neighbour->getNumberOfTroops()
                      << " Owned by: Player " << neighbour->getPlayerOwnerID() << std::endl;
        }
        std::cout << "\n[ATTACKER] Which country would you like to attack?(0 to "
                  << fromCountry->getAdjCountries()->size() - 1 << ")";
        toCountryIndex = player->getStrategy()->intInput(StrategyContext::ATTACK_TO_COUNTRY);
        if (toCountryIndex < 0 || toCountryIndex > (int) fromCountry->getAdjCountries()->size() || cin.fail() || isnan(toCountryIndex)) {
            std::cout << "\nInvalid Input. Please try again.\n";
            continue;
        }
    } while (toCountryIndex < 0 || toCountryIndex > (int) fromCountry->getAdjCountries()->size() || cin.fail() || isnan(toCountryIndex));
    return toCountryIndex;
}